

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heatbath.cpp
# Opt level: O2

int main(void)

{
  result_type_conflict rVar1;
  value_type vVar2;
  bool bVar3;
  ostream *poVar4;
  char *pcVar5;
  char *pcVar6;
  size_t j;
  long lVar7;
  size_t i;
  long lVar8;
  double *w;
  pointer pdVar9;
  vector<double,_std::allocator<double>_> weights;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  transition_matrix;
  uniform_real_distribution<double> local_13c8;
  engine_type eng;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"number of bins = ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&eng,0x72e3);
  local_13c8._M_param._M_a._0_4_ = 0;
  local_13c8._M_param._M_a._4_4_ = 0;
  local_13c8._M_param._M_b._0_4_ = 0;
  local_13c8._M_param._M_b._4_4_ = 0x3ff00000;
  std::vector<double,_std::allocator<double>_>::vector
            (&weights,8,(allocator_type *)&transition_matrix);
  for (pdVar9 = weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar9 != weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar9 = pdVar9 + 1) {
    rVar1 = std::uniform_real_distribution<double>::operator()(&local_13c8,&eng);
    *pdVar9 = rVar1;
  }
  std::operator<<((ostream *)&std::cout,"[weights]\n");
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    poVar4 = std::ostream::_M_insert<double>
                       (weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar8]);
    std::operator<<(poVar4,' ');
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  transition_matrix.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  transition_matrix.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  transition_matrix.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bcl::heatbath::
  generate_transition_matrix_resize<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
            (&weights,&transition_matrix);
  std::operator<<((ostream *)&std::cout,"[transition matrix]\n");
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
      poVar4 = std::ostream::_M_insert<double>
                         (transition_matrix.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar8].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar7]);
      std::operator<<(poVar4,' ');
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::operator<<((ostream *)&std::cout,"[check transition matrix]\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"probability conservation = ");
  bVar3 = bcl::
          check_probability_conservation<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
                    (&transition_matrix,1e-10);
  pcVar5 = "fail";
  pcVar6 = "fail";
  if (bVar3) {
    pcVar6 = "pass";
  }
  poVar4 = std::operator<<(poVar4,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"detailed balance condition = ");
  bVar3 = bcl::
          check_detailed_balance<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
                    (&weights,&transition_matrix,1e-10);
  pcVar6 = "fail";
  if (bVar3) {
    pcVar6 = "pass";
  }
  poVar4 = std::operator<<(poVar4,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"balance condition = ");
  bVar3 = bcl::
          check_balance_condition<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
                    (&weights,&transition_matrix,1e-10);
  if (bVar3) {
    pcVar5 = "pass";
  }
  poVar4 = std::operator<<(poVar4,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<((ostream *)&std::cout,"average rejection = ");
  vVar2 = bcl::
          average_rejection<std::vector<double,std::allocator<double>>,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
                    (&weights,&transition_matrix);
  poVar4 = std::ostream::_M_insert<double>(vVar2);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&transition_matrix);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&weights.super__Vector_base<double,_std::allocator<double>_>);
  return 0;
}

Assistant:

int main() {
try {
  std::cout << "number of bins = " << n << std::endl;

  // random number generator
  typedef std::mt19937 engine_type;
  engine_type eng(29411);
  std::uniform_real_distribution<> dist;

  // generate weights
  std::vector<double> weights(n);
  for (auto& w : weights) w = dist(eng);
  std::cout << "[weights]\n";
  for (std::size_t i = 0; i < n; ++i) std::cout << weights[i] << ' ';
  std::cout << std::endl;

  // generate transtition matrix
  std::vector<std::vector<double> > transition_matrix;
  bcl::heatbath::generate_transition_matrix_resize(weights, transition_matrix);

  std::cout << "[transition matrix]\n";
  for (std::size_t i = 0; i < n; ++i) {
    for (std::size_t j = 0; j < n; ++j) {
      std::cout << transition_matrix[i][j] << ' ';
    }
    std::cout << std::endl;
  }

  // check transition matrix
  std::cout << "[check transition matrix]\n";
  std::cout << "probability conservation = "
            << (bcl::check_probability_conservation(transition_matrix) ? "pass" : "fail")
            << std::endl;
  std::cout << "detailed balance condition = "
            << (bcl::check_detailed_balance(weights, transition_matrix) ? "pass" : "fail")
            << std::endl;
  std::cout << "balance condition = "
            << (bcl::check_balance_condition(weights, transition_matrix) ? "pass" : "fail")
            << std::endl;

  std::cout << "average rejection = " << bcl::average_rejection(weights, transition_matrix) 
            << std::endl;
}
catch (const std::exception& excp) {
  std::cerr << excp.what() << std::endl;
  std::exit(-1); }
catch (...) {
  std::cerr << "Unknown exception occurred!" << std::endl;
  std::exit(-1); }
}